

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O3

void SVRG::predict(svrg *s,single_learner *param_2,example *ec)

{
  float fVar1;
  float acc;
  float local_1c;
  
  local_1c = (ec->l).simple.initial;
  GD::foreach_feature<float,_float_&,_&SVRG::vec_add>(s->all,ec,&local_1c);
  ec->partial_prediction = local_1c;
  fVar1 = GD::finalize_prediction(s->all->sd,local_1c);
  (ec->pred).scalar = fVar1;
  return;
}

Assistant:

void predict(svrg& s, single_learner&, example& ec)
{
  ec.partial_prediction = inline_predict<W_INNER>(*s.all, ec);
  ec.pred.scalar = GD::finalize_prediction(s.all->sd, ec.partial_prediction);
}